

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

bool * __thiscall QHash<int,_bool>::operator[](QHash<int,_bool> *this,int *key)

{
  bool *pbVar1;
  long in_FS_OFFSET;
  int *in_stack_ffffffffffffffb8;
  QHash<int,_bool> local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  tryEmplace<>(local_20,in_stack_ffffffffffffffb8);
  pbVar1 = iterator::operator*((iterator *)0x44b5c3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pbVar1;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        return *tryEmplace(key).iterator;
    }